

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5NextMethod(sqlite3_vtab_cursor *pCursor)

{
  long iFirst;
  sqlite3_vtab *psVar1;
  sqlite3_vtab *psVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  
  iVar5 = *(int *)&pCursor[4].pVtab;
  if (iVar5 < 3) {
    bVar7 = false;
    iVar4 = 0;
    if (((ulong)pCursor[10].pVtab & 0x20) != 0) {
      iFirst = ((Fts5Expr *)pCursor[8].pVtab)->pRoot->iRowid;
      iVar4 = sqlite3Fts5ExprFirst
                        ((Fts5Expr *)pCursor[8].pVtab,*(Fts5Index **)&pCursor->pVtab[1].nRef,iFirst,
                         *(int *)((long)&pCursor[4].pVtab + 4));
      bVar7 = false;
      if (iVar4 == 0) {
        bVar7 = iFirst != *(long *)((pCursor[8].pVtab)->zErrMsg + 0x18);
      }
      uVar6 = *(uint *)&pCursor[10].pVtab & 0xffffff91;
      *(uint *)&pCursor[10].pVtab = uVar6 + 0x4e;
      if (*(int *)((pCursor[8].pVtab)->zErrMsg + 4) != 0) {
        *(uint *)&pCursor[10].pVtab = uVar6 | 0x4f;
        bVar7 = true;
      }
    }
    if (!bVar7 && iVar4 == 0) {
      psVar1 = pCursor[6].pVtab;
      psVar2 = pCursor[8].pVtab;
      pcVar3 = psVar2->zErrMsg;
      do {
        iVar4 = (**(code **)(pcVar3 + 0x10))(psVar2,pcVar3,0,0);
      } while (*(int *)(pcVar3 + 8) != 0);
      bVar7 = *(long *)(pcVar3 + 0x18) < (long)psVar1;
      if (*(int *)&psVar2[1].pModule == 0) {
        bVar7 = (long)psVar1 < *(long *)(pcVar3 + 0x18);
      }
      if (bVar7) {
        pcVar3[4] = '\x01';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
      }
      *(uint *)&pCursor[10].pVtab =
           *(uint *)((pCursor[8].pVtab)->zErrMsg + 4) | *(uint *)&pCursor[10].pVtab | 0x4e;
    }
  }
  else {
    if (iVar5 == 4) {
      iVar5 = fts5SorterNext((Fts5Cursor *)pCursor);
      return iVar5;
    }
    if (iVar5 == 3) {
      *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 1;
      iVar4 = 0;
    }
    else {
      iVar5 = sqlite3_step((sqlite3_stmt *)pCursor[7].pVtab);
      iVar4 = 0;
      if (iVar5 != 100) {
        *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 1;
        iVar5 = sqlite3_reset((sqlite3_stmt *)pCursor[7].pVtab);
        return iVar5;
      }
    }
  }
  return iVar4;
}

Assistant:

static int fts5NextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc;

  assert( (pCsr->ePlan<3)==
          (pCsr->ePlan==FTS5_PLAN_MATCH || pCsr->ePlan==FTS5_PLAN_SOURCE) 
  );
  assert( !CsrFlagTest(pCsr, FTS5CSR_EOF) );

  if( pCsr->ePlan<3 ){
    int bSkip = 0;
    if( (rc = fts5CursorReseek(pCsr, &bSkip)) || bSkip ) return rc;
    rc = sqlite3Fts5ExprNext(pCsr->pExpr, pCsr->iLastRowid);
    CsrFlagSet(pCsr, sqlite3Fts5ExprEof(pCsr->pExpr));
    fts5CsrNewrow(pCsr);
  }else{
    switch( pCsr->ePlan ){
      case FTS5_PLAN_SPECIAL: {
        CsrFlagSet(pCsr, FTS5CSR_EOF);
        rc = SQLITE_OK;
        break;
      }
  
      case FTS5_PLAN_SORTED_MATCH: {
        rc = fts5SorterNext(pCsr);
        break;
      }
  
      default:
        rc = sqlite3_step(pCsr->pStmt);
        if( rc!=SQLITE_ROW ){
          CsrFlagSet(pCsr, FTS5CSR_EOF);
          rc = sqlite3_reset(pCsr->pStmt);
        }else{
          rc = SQLITE_OK;
        }
        break;
    }
  }
  
  return rc;
}